

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

longlong __thiscall QPDFObjectHandle::getIntValue(QPDFObjectHandle *this)

{
  allocator<char> local_41;
  string local_40;
  QPDF_Integer *local_20;
  QPDF_Integer *integer;
  QPDFObjectHandle *this_local;
  
  integer = (QPDF_Integer *)this;
  local_20 = ::qpdf::BaseHandle::as<QPDF_Integer>(&this->super_BaseHandle);
  if (local_20 == (QPDF_Integer *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"returning 0",&local_41);
    typeWarning(this,"integer",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    QTC::TC("qpdf","QPDFObjectHandle integer returning 0",0);
    this_local = (QPDFObjectHandle *)0x0;
  }
  else {
    this_local = (QPDFObjectHandle *)local_20->val;
  }
  return (longlong)this_local;
}

Assistant:

long long
QPDFObjectHandle::getIntValue() const
{
    if (auto integer = as<QPDF_Integer>()) {
        return integer->val;
    } else {
        typeWarning("integer", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle integer returning 0");
        return 0;
    }
}